

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void run(string *rootDir,string *containerId,string *distroName,string *command,
        ResourceLimits *resourceLimits,bool buildImage)

{
  bool bVar1;
  ostream *poVar2;
  Container *container_00;
  Container *container;
  bool isImage;
  bool buildImage_local;
  ResourceLimits *resourceLimits_local;
  string *command_local;
  string *distroName_local;
  string *containerId_local;
  string *rootDir_local;
  
  bVar1 = imageExists(rootDir,containerId);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Running image ");
    poVar2 = std::operator<<(poVar2,(string *)containerId);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  container_00 = createContainer(distroName,containerId,rootDir,command,resourceLimits,buildImage,
                                 bVar1);
  bVar1 = setUpContainer(container_00);
  if (bVar1) {
    startContainer(container_00);
  }
  cleanUpContainer(container_00);
  return;
}

Assistant:

void run(std::string rootDir,
         std::string containerId,
         std::string distroName,
         std::string command,
         ResourceLimits* resourceLimits,
         bool buildImage)
{
    bool isImage = imageExists(rootDir, containerId);

    if (isImage)
        std::cout << "Running image " << containerId << std::endl;

    Container* container = createContainer(distroName, containerId, rootDir,
                                           command, resourceLimits, buildImage, isImage);
    if (setUpContainer(container))
    {
        startContainer(container);
    }
    cleanUpContainer(container);
}